

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>
rectangleFromVertices(Vector3 *pA,Vector3 *pB,Vector3 *pC)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined8 *in_RCX;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  Vector3 local_28;
  Vector3 local_18;
  
  uVar1 = pC->x;
  uVar3 = pC->y;
  uVar2 = pB->x;
  uVar4 = pB->y;
  local_18.x = (float)uVar1 - (float)uVar2;
  local_18.y = (float)uVar3 - (float)uVar4;
  fVar8 = pB->z;
  local_28.x = (float)*in_RCX - (float)uVar2;
  local_28.y = (float)((ulong)*in_RCX >> 0x20) - (float)uVar4;
  fVar7 = local_18.x * local_28.y - local_18.y * local_28.x;
  local_28.z = *(float *)(in_RCX + 1) - fVar8;
  local_18.z = pC->z - fVar8;
  auVar6._0_4_ = local_18.y * local_28.z - local_28.y * local_18.z;
  auVar6._4_4_ = local_28.x * local_18.z - local_28.z * local_18.x;
  auVar6._8_4_ = (0.0 - fVar8) * 0.0 - local_28.y * (0.0 - fVar8);
  auVar6._12_4_ = (0.0 - fVar8) * 0.0 - local_18.z * (0.0 - fVar8);
  fVar8 = SQRT(fVar7 * fVar7 + auVar6._0_4_ * auVar6._0_4_ + auVar6._4_4_ * auVar6._4_4_);
  auVar5._4_4_ = fVar8;
  auVar5._0_4_ = fVar8;
  auVar5._8_4_ = local_18.y;
  auVar5._12_4_ = local_18.y;
  divps(auVar6,auVar5);
  std::make_unique<pm::Rectangle,pm::Vector3_const&,pm::Vector3,pm::Vector3,pm::Vector3&>
            (pA,pB,&local_18,&local_28);
  return (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)
         (__uniq_ptr_data<pm::Rectangle,_std::default_delete<pm::Rectangle>,_true,_true>)pA;
}

Assistant:

std::unique_ptr<pm::Rectangle> rectangleFromVertices(const pm::Vector3 pA, const pm::Vector3 pB, const pm::Vector3 pC)
{
	auto rect = std::make_unique<pm::Rectangle>(pA, pB - pA, pC - pA, cross(pB - pA, pC - pA).normalize());
	return rect;
}